

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

void h265e_dpb_dump_frm(H265eDpb *dpb,char *fmt)

{
  int iVar1;
  H265eDpbFrm *frm;
  RK_S32 frm_cnt;
  RK_S32 pos;
  char buf [256];
  int local_1c;
  RK_S32 i;
  char *fmt_local;
  H265eDpb *dpb_local;
  
  frm._4_4_ = snprintf((char *)&frm_cnt,0xff,"total %2d ",0x11);
  for (local_1c = 0; local_1c < 0x11; local_1c = local_1c + 1) {
    iVar1 = snprintf((char *)((long)&frm_cnt + (long)frm._4_4_),0xff - (long)frm._4_4_,"%04x ",
                     (ulong)dpb->frame_list[local_1c].field_7.on_used);
    frm._4_4_ = iVar1 + frm._4_4_;
  }
  _mpp_log_l(4,"h265e_dpb","%20s %s",(char *)0x0,fmt,&frm_cnt);
  return;
}

Assistant:

void h265e_dpb_dump_frm(H265eDpb *dpb, const char *fmt)
{
    RK_S32 i = 0;
    char buf[256];
    RK_S32 pos = 0;
    RK_S32 frm_cnt = MPP_ARRAY_ELEMS(dpb->frame_list);

    pos += snprintf(buf, sizeof(buf) - 1, "total %2d ", frm_cnt);

    for (i = 0; i < frm_cnt; i++) {
        H265eDpbFrm *frm = &dpb->frame_list[i];

        pos += snprintf(buf + pos, sizeof(buf) - 1 - pos, "%04x ", frm->on_used);
    }
    mpp_log("%20s %s", fmt, buf);
}